

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  unsigned_short *puVar1;
  FuncState *fs;
  int iVar2;
  BinOpr BVar3;
  Proto *pPVar4;
  byte bVar5;
  uint uVar6;
  UnOpr op;
  BinOpr op_00;
  ulong uVar7;
  expdesc v2;
  expdesc local_48;
  
  uVar6 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar6;
  if (200 < (uVar6 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  iVar2 = (ls->t).token;
  if (iVar2 < 0x113) {
    if (0x106 < iVar2) {
      switch(iVar2) {
      case 0x107:
        v->t = -1;
        v->f = -1;
        v->k = VFALSE;
        break;
      default:
        goto switchD_00110fe3_caseD_108;
      case 0x109:
        luaX_next(ls);
        body(ls,v,0,ls->linenumber);
        goto LAB_00111184;
      case 0x10d:
        v->t = -1;
        v->f = -1;
        v->k = VNIL;
        break;
      case 0x10e:
        op = OPR_NOT;
        goto LAB_00111150;
      }
LAB_0011110f:
      (v->u).s.info = 0;
      goto LAB_0011113b;
    }
    if (iVar2 == 0x23) {
      op = OPR_LEN;
    }
    else {
      if (iVar2 != 0x2d) {
        if (iVar2 != 0x7b) goto switchD_00110fe3_caseD_108;
        constructor(ls,v);
        goto LAB_00111184;
      }
      op = OPR_MINUS;
    }
LAB_00111150:
    luaX_next(ls);
    subexpr(ls,v,8);
    luaK_prefix(ls->fs,op,v);
  }
  else {
    if (iVar2 < 0x11c) {
      if (iVar2 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0011110f;
      }
      if (iVar2 != 0x117) goto switchD_00110fe3_caseD_108;
      fs = ls->fs;
      pPVar4 = fs->f;
      bVar5 = pPVar4->is_vararg;
      if (bVar5 == 0) {
        luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        pPVar4 = fs->f;
        bVar5 = pPVar4->is_vararg;
      }
      pPVar4->is_vararg = bVar5 & 0xfb;
      iVar2 = luaK_codeABC(fs,OP_VARARG,0,1,0);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
LAB_001110c4:
      (v->u).s.info = iVar2;
    }
    else {
      if (iVar2 != 0x11c) {
        if (iVar2 == 0x11e) {
          iVar2 = luaK_stringK(ls->fs,(ls->t).seminfo.ts);
          v->t = -1;
          v->f = -1;
          v->k = VK;
          goto LAB_001110c4;
        }
switchD_00110fe3_caseD_108:
        primaryexp(ls,v);
        goto LAB_00111184;
      }
      v->t = -1;
      v->f = -1;
      v->k = VKNUM;
      (v->u).s.info = 0;
      v->u = (anon_union_8_2_fd02c123_for_u)(ls->t).seminfo;
    }
LAB_0011113b:
    luaX_next(ls);
  }
LAB_00111184:
  iVar2 = (ls->t).token;
  op_00 = OPR_NOBINOPR;
  if (iVar2 < 0x5e) {
    switch(iVar2) {
    case 0x25:
      uVar7 = 4;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_001111a8_caseD_26;
    case 0x2a:
      uVar7 = 2;
      break;
    case 0x2b:
      uVar7 = 0;
      break;
    case 0x2d:
      uVar7 = 1;
      break;
    case 0x2f:
      uVar7 = 3;
      break;
    default:
      if (iVar2 == 0x3c) {
        uVar7 = 9;
      }
      else {
        if (iVar2 != 0x3e) goto switchD_001111a8_caseD_26;
        uVar7 = 0xb;
      }
    }
  }
  else {
    switch(iVar2) {
    case 0x10f:
      uVar7 = 0xe;
      break;
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x117:
      goto switchD_001111a8_caseD_26;
    case 0x116:
      uVar7 = 6;
      break;
    case 0x118:
      uVar7 = 8;
      break;
    case 0x119:
      uVar7 = 0xc;
      break;
    case 0x11a:
      uVar7 = 10;
      break;
    case 0x11b:
      uVar7 = 7;
      break;
    default:
      if (iVar2 == 0x5e) {
        uVar7 = 5;
      }
      else {
        if (iVar2 != 0x101) goto switchD_001111a8_caseD_26;
        uVar7 = 0xd;
      }
    }
  }
  do {
    op_00 = (BinOpr)uVar7;
    if (priority[uVar7].left <= limit) goto switchD_001111a8_caseD_26;
    luaX_next(ls);
    luaK_infix(ls->fs,op_00,v);
    BVar3 = subexpr(ls,&local_48,(uint)priority[uVar7].right);
    luaK_posfix(ls->fs,op_00,v,&local_48);
    uVar7 = (ulong)BVar3;
  } while (BVar3 != OPR_NOBINOPR);
  op_00 = OPR_NOBINOPR;
switchD_001111a8_caseD_26:
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op_00;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, unsigned int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    luaX_next(ls);
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than `limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}